

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall
ASDCP::MXF::IABEssenceDescriptor::IABEssenceDescriptor(IABEssenceDescriptor *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  
  GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor
            (&this->super_GenericSoundEssenceDescriptor,d);
  (this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
  super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__GenericSoundEssenceDescriptor_002250a0;
  this_00 = (this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor
            .super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_IABEssenceDescriptor);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    *(bool *)((long)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                     super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL.
                     super_Identifier<16U> + 8) = true;
    *(undefined8 *)
     ((long)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
             super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL.
             super_Identifier<16U> + 9) = uVar1;
    *(undefined8 *)
     ((long)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
             super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL.
             super_Identifier<16U> + 0x11) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1453,"ASDCP::MXF::IABEssenceDescriptor::IABEssenceDescriptor(const Dictionary *)"
               );
}

Assistant:

IABEssenceDescriptor::IABEssenceDescriptor(const Dictionary* d) : GenericSoundEssenceDescriptor(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_IABEssenceDescriptor);
}